

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall Fluid::draw_debug_lines(Fluid *this,mat4 *projection,mat4 *view)

{
  PFNGLUNIFORMMATRIX4FVPROC p_Var1;
  GLint GVar2;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  allocator<char> local_71;
  GLchar *local_70 [4];
  GLchar *local_50 [4];
  
  gfx::Program::use(&this->debug_lines_program);
  p_Var1 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"projection",&local_71);
  GVar2 = (*glad_glGetUniformLocation)((this->debug_lines_program).id,local_50[0]);
  (*p_Var1)(GVar2,1,'\0',(GLfloat *)projection);
  std::__cxx11::string::~string((string *)local_50);
  p_Var1 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"view",&local_71);
  GVar2 = (*glad_glGetUniformLocation)((this->debug_lines_program).id,local_70[0]);
  __fd = 1;
  (*p_Var1)(GVar2,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  std::__cxx11::string::~string((string *)local_70);
  gfx::VAO::bind(&this->debug_lines_vao,__fd,__addr,__len);
  (*glad_glLineWidth)(4.0);
  (*glad_glDrawArrays)(0,0,(this->debug_lines_ssbo)._length);
  gfx::VAO::unbind(&this->debug_lines_vao);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_debug_lines(const glm::mat4& projection, const glm::mat4& view) {
        debug_lines_program.use();
        glUniformMatrix4fv(debug_lines_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(debug_lines_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        debug_lines_vao.bind();
        glLineWidth(4.0);
        glDrawArrays(GL_POINTS, 0, debug_lines_ssbo.length());
        debug_lines_vao.unbind();
        debug_lines_program.disuse();
    }